

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

void print_path_segment_walker(char *segment,void *void_memo)

{
  size_t sVar1;
  char *in_RDI;
  XmlMemo_conflict *memo;
  
  sVar1 = strlen(suite_path);
  strncat(suite_path,in_RDI,0xfff - sVar1);
  print_path_separator_if_needed((int *)0x113b29);
  return;
}

Assistant:

static void print_path_segment_walker(const char *segment, void *void_memo) {
    XmlMemo *memo = (XmlMemo *)void_memo;

    strncat(suite_path, segment, sizeof(suite_path)-strlen(suite_path)-1);
    print_path_separator_if_needed(&memo->segment_count);
}